

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O3

string * ParseGroupFromPath(string *__return_storage_ptr__,string *file)

{
  char cVar1;
  _Alloc_hider _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  string *extraout_RAX;
  size_type sVar5;
  long *plVar6;
  undefined8 *puVar7;
  string *extraout_RAX_00;
  string *psVar8;
  string *extraout_RAX_01;
  int iVar9;
  size_type *psVar10;
  long *plVar11;
  size_type *psVar12;
  string extension;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_60._M_allocated_capacity = (size_type)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,anon_var_dwarf_d10c04 + 9);
  lVar4 = std::__cxx11::string::find((char *)file,0x4f0382,0);
  if (lVar4 != -1) {
    std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)local_60._8_8_,0x4f037e);
  }
  lVar4 = std::__cxx11::string::find((char *)file,0x4f038d,0);
  if (lVar4 != -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"[coverage][.]","");
    psVar8 = extraout_RAX;
    goto LAB_00470e63;
  }
  sVar5 = file->_M_string_length;
  if (sVar5 == 0) {
LAB_00470ba5:
    std::operator+(&local_80,"[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_90 = *plVar11;
      lStack_88 = plVar6[3];
      local_a0 = &local_90;
    }
    else {
      local_90 = *plVar11;
      local_a0 = (long *)*plVar6;
    }
    local_98 = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a0,local_60._M_allocated_capacity);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar12 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar12) {
      lVar4 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    pbVar3 = &local_80;
  }
  else {
    iVar9 = -1;
    do {
      cVar1 = (file->_M_dataplus)._M_p[sVar5 - 1];
      if ((cVar1 == '\\') || (cVar1 == '/')) {
        if (iVar9 != -1) {
          std::__cxx11::string::substr((ulong)&local_40,(ulong)file);
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x4f0ae1);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          psVar10 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_80.field_2._M_allocated_capacity = *psVar10;
            local_80.field_2._8_8_ = puVar7[3];
          }
          else {
            local_80.field_2._M_allocated_capacity = *psVar10;
            local_80._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_80._M_string_length = puVar7[1];
          *puVar7 = psVar10;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
          local_a0 = &local_90;
          plVar6 = puVar7 + 2;
          if ((long *)*puVar7 == plVar6) {
            local_90 = *plVar6;
            lStack_88 = puVar7[3];
          }
          else {
            local_90 = *plVar6;
            local_a0 = (long *)*puVar7;
          }
          local_98 = puVar7[1];
          *puVar7 = plVar6;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_a0,local_60._M_allocated_capacity);
          goto LAB_00470df3;
        }
        iVar9 = (int)sVar5 + -1;
      }
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
    if (iVar9 == -1) goto LAB_00470ba5;
    std::__cxx11::string::substr((ulong)&local_40,(ulong)file);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x4f0ae1);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_80.field_2._M_allocated_capacity = *psVar10;
      local_80.field_2._8_8_ = plVar6[3];
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar10;
      local_80._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_80._M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
    local_a0 = &local_90;
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_90 = *plVar6;
      lStack_88 = puVar7[3];
    }
    else {
      local_90 = *plVar6;
      local_a0 = (long *)*puVar7;
    }
    local_98 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a0,local_60._M_allocated_capacity);
LAB_00470df3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar12 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar12) {
      lVar4 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    pbVar3 = &local_40;
  }
  psVar8 = (string *)&pbVar3->field_2;
  _Var2._M_p = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)psVar8 + -0x10))->_M_dataplus)._M_p;
  if ((string *)_Var2._M_p != psVar8) {
    operator_delete(_Var2._M_p);
    psVar8 = extraout_RAX_00;
  }
LAB_00470e63:
  if ((undefined1 *)local_60._M_allocated_capacity != local_50) {
    operator_delete((void *)local_60._M_allocated_capacity);
    psVar8 = extraout_RAX_01;
  }
  return psVar8;
}

Assistant:

static string ParseGroupFromPath(string file) {
	string extension = "";
	if (file.find(".test_slow") != std::string::npos) {
		// "slow" in the name indicates a slow test (i.e. only run as part of allunit)
		extension = "[.]";
	}
	if (file.find(".test_coverage") != std::string::npos) {
		// "coverage" in the name indicates a coverage test (i.e. only run as part of coverage)
		return "[coverage][.]";
	}
	// move backwards to the last slash
	int group_begin = -1, group_end = -1;
	for (idx_t i = file.size(); i > 0; i--) {
		if (file[i - 1] == '/' || file[i - 1] == '\\') {
			if (group_end == -1) {
				group_end = i - 1;
			} else {
				group_begin = i;
				return "[" + file.substr(group_begin, group_end - group_begin) + "]" + extension;
			}
		}
	}
	if (group_end == -1) {
		return "[" + file + "]" + extension;
	}
	return "[" + file.substr(0, group_end) + "]" + extension;
}